

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O3

void decode_fglrx_ioctl_drv_info(fglrx_ioctl_drv_info *d,mmt_memory_dump *args,int argc)

{
  mmt_buf *buf;
  mmt_buf *buf_00;
  mmt_buf *buf_01;
  bool bVar1;
  bool bVar2;
  
  bVar2 = true;
  bVar1 = true;
  if (fglrx_show_unk_zero_fields != 0 || d->unk00 != 0) {
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx);
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk04 != 0) || (!bVar1)) {
    fprintf(_stdout,"%sunk04: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk08 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk08: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk0c != 0) || (!bVar1)) {
    fprintf(_stdout,"%sunk0c: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  fprintf(_stdout,"%sdrv_id_len: %d",", ",(ulong)d->drv_id_len);
  fglrx_pfx = ", ";
  if (d->_pad14 != 0) {
    fprintf(_stdout,"%s%s_pad14: 0x%08x%s",", ",colors->err,(ulong)d->_pad14,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->drv_id == 0) {
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%sdrv_id: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%sdrv_id: 0x%016lx",", ");
    if (0 < argc) {
      buf = find_ptr(d->drv_id,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0024abb7;
    }
    fputs(" [no data]",_stdout);
    buf = (mmt_buf *)0x0;
  }
LAB_0024abb7:
  fglrx_pfx = ", ";
  fprintf(_stdout,"%sdrv_date_len: %d",", ",(ulong)d->drv_date_len);
  fglrx_pfx = ", ";
  if (d->_pad24 != 0) {
    fprintf(_stdout,"%s%s_pad24: 0x%08x%s",", ",colors->err,(ulong)d->_pad24,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->drv_date == 0) {
    buf_00 = (mmt_buf *)0x0;
    fprintf(_stdout,"%sdrv_date: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%sdrv_date: 0x%016lx",", ");
    if (0 < argc) {
      buf_00 = find_ptr(d->drv_date,args,argc);
      if (buf_00 != (mmt_buf *)0x0) goto LAB_0024ac8b;
    }
    fputs(" [no data]",_stdout);
    buf_00 = (mmt_buf *)0x0;
  }
LAB_0024ac8b:
  fglrx_pfx = ", ";
  fprintf(_stdout,"%sdrv_name_len: %d",", ",(ulong)d->drv_name_len);
  fglrx_pfx = ", ";
  if (d->_pad34 != 0) {
    fprintf(_stdout,"%s%s_pad34: 0x%08x%s",", ",colors->err,(ulong)d->_pad34,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->drv_name == 0) {
    buf_01 = (mmt_buf *)0x0;
    fprintf(_stdout,"%sdrv_name: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%sdrv_name: 0x%016lx",", ");
    if (0 < argc) {
      buf_01 = find_ptr(d->drv_name,args,argc);
      if (buf_01 != (mmt_buf *)0x0) goto LAB_0024ad5f;
    }
    fputs(" [no data]",_stdout);
    buf_01 = (mmt_buf *)0x0;
  }
LAB_0024ad5f:
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(buf,"drv_id");
  }
  if (buf_00 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(buf_00,"drv_date");
  }
  if (buf_01 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(buf_01,"drv_name");
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_drv_info(struct fglrx_ioctl_drv_info *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_x32(d, unk0c);
	fglrx_print_d32(d, drv_id_len);
	fglrx_print_pad_x32(d, _pad14);
	struct mmt_buf *drv_id = fglrx_print_ptr(d, drv_id, args, argc);
	fglrx_print_d32(d, drv_date_len);
	fglrx_print_pad_x32(d, _pad24);
	struct mmt_buf *drv_date = fglrx_print_ptr(d, drv_date, args, argc);
	fglrx_print_d32(d, drv_name_len);
	fglrx_print_pad_x32(d, _pad34);
	struct mmt_buf *drv_name = fglrx_print_ptr(d, drv_name, args, argc);
	mmt_log_cont_nl();

	if (drv_id)
		dump_mmt_buf_as_text(drv_id, "drv_id");
	if (drv_date)
		dump_mmt_buf_as_text(drv_date, "drv_date");
	if (drv_name)
		dump_mmt_buf_as_text(drv_name, "drv_name");
}